

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsSpreadsheetReportLayout.cpp
# Opt level: O1

qreal __thiscall KDReports::SpreadsheetReportLayout::totalWidth(SpreadsheetReportLayout *this)

{
  long lVar1;
  long lVar2;
  qreal qVar3;
  
  lVar1 = (this->m_tableLayout).m_columnWidths.d.size;
  if (lVar1 < 1) {
    qVar3 = 0.0;
  }
  else {
    qVar3 = 0.0;
    lVar2 = 0;
    do {
      qVar3 = qVar3 + (this->m_tableLayout).m_columnWidths.d.ptr[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  if ((this->m_tableLayout).m_verticalHeaderVisible != false) {
    qVar3 = qVar3 + (this->m_tableLayout).m_vHeaderWidth;
  }
  return qVar3;
}

Assistant:

qreal KDReports::SpreadsheetReportLayout::totalWidth() const
{
    qreal totalWidth = 0;
    for (int col = 0; col < m_tableLayout.m_columnWidths.size(); ++col) {
        totalWidth += m_tableLayout.m_columnWidths[col];
    }
    if (m_tableLayout.m_verticalHeaderVisible)
        totalWidth += m_tableLayout.vHeaderWidth();
    return totalWidth;
}